

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

void mafilter_wt(double *sig,int N,double *weights,int window,double *oup)

{
  void *__ptr;
  double *temp;
  double sum;
  int ct;
  int j;
  int i;
  int N2;
  int q;
  int odd;
  double *oup_local;
  int window_local;
  double *weights_local;
  int N_local;
  double *sig_local;
  
  if (window % 2 == 0) {
    i = window / 2;
    j = N + i * 2 + -1;
  }
  else {
    i = (window + -1) / 2;
    j = N + i * 2;
  }
  __ptr = malloc((long)j << 3);
  for (ct = 0; ct < i; ct = ct + 1) {
    *(double *)((long)__ptr + (long)ct * 8) = *sig;
  }
  for (ct = i; ct < N + i; ct = ct + 1) {
    *(double *)((long)__ptr + (long)ct * 8) = sig[ct - i];
  }
  for (ct = N + i; ct < j; ct = ct + 1) {
    *(double *)((long)__ptr + (long)ct * 8) = sig[N + -1];
  }
  if (window % 2 == 0) {
    for (ct = i; ct < N + i; ct = ct + 1) {
      temp = (double *)0x0;
      sum._0_4_ = 0;
      for (sum._4_4_ = ct - i; sum._4_4_ < ct + i; sum._4_4_ = sum._4_4_ + 1) {
        temp = (double *)
               (weights[sum._0_4_] * *(double *)((long)__ptr + (long)sum._4_4_ * 8) + (double)temp);
        sum._0_4_ = sum._0_4_ + 1;
      }
      oup[ct - i] = (double)temp;
    }
  }
  else {
    for (ct = i; ct < N + i; ct = ct + 1) {
      temp = (double *)0x0;
      sum._0_4_ = 0;
      for (sum._4_4_ = ct - i; sum._4_4_ < ct + i + 1; sum._4_4_ = sum._4_4_ + 1) {
        temp = (double *)
               (weights[sum._0_4_] * *(double *)((long)__ptr + (long)sum._4_4_ * 8) + (double)temp);
        sum._0_4_ = sum._0_4_ + 1;
      }
      oup[ct - i] = (double)temp;
    }
  }
  free(__ptr);
  return;
}

Assistant:

void mafilter_wt(double *sig,int N, double *weights, int window,double *oup) {
	int odd,q,N2,i,j,ct;
	double sum;
	double *temp;
	
	/*  Accepts Normalized weights. 
	 *  If the weight is not normalized then normalize it by
	 *  dividing all the weights by the sum of all the weights
	 *  [1,1,1,1,1] normalizes to [1,1,1,1,1] / 5 = [0.2,0.2,0.2,0.2,0.2]
	 */ 
	
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
		N2 = N + (2 * q);
	} else {
		q = window / 2;
		N2 = N + (2 * q) - 1;
	}
	
	
	temp = (double*) malloc (sizeof(double) * N2);
	
	for (i = 0; i < q; ++i) {
		temp[i] = sig[0];
	}
	
	for (i = q; i < N + q; ++i) {
		temp[i] = sig[i - q];
	}
	
	for (i = N + q; i < N2; ++i) {
		temp[i] = sig[N-1];
	}
	
	if (odd) {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			ct = 0;
			for (j = i - q; j < i + q + 1;j++) {
				sum += weights[ct] * temp[j];
				ct++;
			}
			oup[i-q] = sum;
		}  
	} else {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			ct = 0;
			for (j = i - q; j < i + q;j++) {
				sum += weights[ct] * temp[j];
				ct++;
			}
			oup[i-q] = sum;
		}  
	}
	
	
	free(temp);
}